

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geodesic.cpp
# Opt level: O0

void Geodesic::splitOnCommonEdge
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
               vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *reference_leaf_num_map,vector<PhyloTree,_std::allocator<PhyloTree>_> *destination_a,
               vector<PhyloTree,_std::allocator<PhyloTree>_> *destination_b)

{
  bool bVar1;
  vector<PhyloTree,_std::allocator<PhyloTree>_> *destination_b_00;
  Bipartition *pBVar2;
  reference pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RDX;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RSI;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_RDI;
  vector<PhyloTree,_std::allocator<PhyloTree>_> *in_R8;
  int j_5;
  int j_4;
  size_t j_3;
  size_t j_2;
  size_t j_1;
  size_t j;
  size_t i;
  size_t indexBleaves;
  size_t indexAleaves;
  bool aLeavesAdded;
  PhyloTreeEdge e_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1_1;
  PhyloTreeEdge e;
  iterator __end1;
  iterator __begin1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *__range1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesB2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesB1;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesA2;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> edgesA1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leaf2NumMapB;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  leaf2NumMapA;
  edge_not_found_exception *err;
  PhyloTreeEdge commonEdge;
  string leaf_label;
  size_t numEdges2;
  size_t numEdges1;
  PhyloTreeEdge *in_stack_fffffffffffffd08;
  undefined7 in_stack_fffffffffffffd10;
  undefined1 in_stack_fffffffffffffd17;
  undefined1 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd19;
  undefined1 in_stack_fffffffffffffd1a;
  undefined1 in_stack_fffffffffffffd1b;
  undefined1 in_stack_fffffffffffffd1c;
  undefined1 in_stack_fffffffffffffd1d;
  undefined1 in_stack_fffffffffffffd1e;
  undefined1 in_stack_fffffffffffffd1f;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *in_stack_fffffffffffffd20;
  Bipartition *this;
  char *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  int local_2c0;
  int local_2bc;
  size_type in_stack_fffffffffffffd48;
  ulong __n;
  vector<PhyloTree,_std::allocator<PhyloTree>_> *in_stack_fffffffffffffd50;
  size_type local_2a8;
  vector<PhyloTree,_std::allocator<PhyloTree>_> *local_2a0;
  string local_298 [32];
  Bipartition *local_278;
  long local_270;
  long local_268;
  byte local_259;
  PhyloTreeEdge *local_210;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_208 [11];
  PhyloTreeEdge *local_1b0;
  __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
  local_1a8 [2];
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_198;
  pointer in_stack_fffffffffffffe80;
  pointer in_stack_fffffffffffffe88;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_168;
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> local_150 [3];
  undefined4 local_104;
  string local_58 [32];
  size_type local_38;
  
  destination_b_00 =
       (vector<PhyloTree,_std::allocator<PhyloTree>_> *)
       std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(in_RDI);
  local_38 = std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::size(in_RSI);
  if ((destination_b_00 != (vector<PhyloTree,_std::allocator<PhyloTree>_> *)0x0) && (local_38 != 0))
  {
    std::__cxx11::string::string(local_58);
    PhyloTreeEdge::PhyloTreeEdge
              ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    PhyloTree::getFirstCommonEdge
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffe88,
               (vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffe80);
    PhyloTreeEdge::operator=
              ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
               in_stack_fffffffffffffd08);
    PhyloTreeEdge::~PhyloTreeEdge
              ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x15f944);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x15f951);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x15f963);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x15f970);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x15f97d);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)0x15f98a);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::reserve
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)in_stack_fffffffffffffd50,
               in_stack_fffffffffffffd48);
    local_1a8[0]._M_current =
         (PhyloTreeEdge *)
         std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                   (in_stack_fffffffffffffd08);
    local_1b0 = (PhyloTreeEdge *)
                std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                          ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                           in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                              (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)in_stack_fffffffffffffd08), bVar1) {
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*(local_1a8);
      PhyloTreeEdge::PhyloTreeEdge
                ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08);
      Bipartition::clear((Bipartition *)0x15fa67);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                (in_stack_fffffffffffffd20,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffd1f,
                          CONCAT16(in_stack_fffffffffffffd1e,
                                   CONCAT15(in_stack_fffffffffffffd1d,
                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                     CONCAT13(in_stack_fffffffffffffd1b,
                                                              CONCAT12(in_stack_fffffffffffffd1a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffd19,
                                                  in_stack_fffffffffffffd18))))))));
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                (in_stack_fffffffffffffd20,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffd1f,
                          CONCAT16(in_stack_fffffffffffffd1e,
                                   CONCAT15(in_stack_fffffffffffffd1d,
                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                     CONCAT13(in_stack_fffffffffffffd1b,
                                                              CONCAT12(in_stack_fffffffffffffd1a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffd19,
                                                  in_stack_fffffffffffffd18))))))));
      PhyloTreeEdge::~PhyloTreeEdge
                ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++(local_1a8);
    }
    local_208[0]._M_current =
         (PhyloTreeEdge *)
         std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::begin
                   (in_stack_fffffffffffffd08);
    local_210 = (PhyloTreeEdge *)
                std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::end
                          ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                           in_stack_fffffffffffffd08);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                              (__normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
                               *)in_stack_fffffffffffffd08), bVar1) {
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator*(local_208);
      PhyloTreeEdge::PhyloTreeEdge
                ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                 in_stack_fffffffffffffd08);
      Bipartition::clear((Bipartition *)0x15fb79);
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                (in_stack_fffffffffffffd20,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffd1f,
                          CONCAT16(in_stack_fffffffffffffd1e,
                                   CONCAT15(in_stack_fffffffffffffd1d,
                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                     CONCAT13(in_stack_fffffffffffffd1b,
                                                              CONCAT12(in_stack_fffffffffffffd1a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffd19,
                                                  in_stack_fffffffffffffd18))))))));
      std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                (in_stack_fffffffffffffd20,
                 (value_type *)
                 CONCAT17(in_stack_fffffffffffffd1f,
                          CONCAT16(in_stack_fffffffffffffd1e,
                                   CONCAT15(in_stack_fffffffffffffd1d,
                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                     CONCAT13(in_stack_fffffffffffffd1b,
                                                              CONCAT12(in_stack_fffffffffffffd1a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffd19,
                                                  in_stack_fffffffffffffd18))))))));
      PhyloTreeEdge::~PhyloTreeEdge
                ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
      __gnu_cxx::
      __normal_iterator<PhyloTreeEdge_*,_std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>_>
      ::operator++(local_208);
    }
    local_259 = 0;
    local_268 = 0;
    local_270 = 0;
    local_278 = (Bipartition *)0x0;
    while (this = local_278,
          pBVar2 = (Bipartition *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_RDX), this < pBVar2) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_RDX,(size_type)local_278);
      std::__cxx11::string::operator=(local_58,(string *)pvVar3);
      in_stack_fffffffffffffd1f =
           Bipartition::contains
                     (this,CONCAT17(in_stack_fffffffffffffd1f,
                                    CONCAT16(in_stack_fffffffffffffd1e,
                                             CONCAT15(in_stack_fffffffffffffd1d,
                                                      CONCAT14(in_stack_fffffffffffffd1c,
                                                               CONCAT13(in_stack_fffffffffffffd1b,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffd1a,
                                                  CONCAT11(in_stack_fffffffffffffd19,
                                                           in_stack_fffffffffffffd18))))))));
      if ((bool)in_stack_fffffffffffffd1f) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,(value_type *)
                            CONCAT17(in_stack_fffffffffffffd1f,
                                     CONCAT16(in_stack_fffffffffffffd1e,
                                              CONCAT15(in_stack_fffffffffffffd1d,
                                                       CONCAT14(in_stack_fffffffffffffd1c,
                                                                CONCAT13(in_stack_fffffffffffffd1b,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffd1a,
                                                  CONCAT11(in_stack_fffffffffffffd19,
                                                           in_stack_fffffffffffffd18))))))));
        if ((local_259 & 1) == 0) {
          std::operator+(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10),
                      (value_type *)in_stack_fffffffffffffd08);
          std::__cxx11::string::~string(local_298);
          for (local_2a0 = (vector<PhyloTree,_std::allocator<PhyloTree>_> *)0x0;
              local_2a0 < destination_b_00;
              local_2a0 = (vector<PhyloTree,_std::allocator<PhyloTree>_> *)
                          ((long)&(local_2a0->
                                  super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>)._M_impl
                                  .super__Vector_impl_data._M_start + 1)) {
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                      (in_RDI,(size_type)local_2a0);
            in_stack_fffffffffffffd1e =
                 Bipartition::properlyContains
                           (this,(Bipartition *)
                                 CONCAT17(in_stack_fffffffffffffd1f,
                                          CONCAT16(in_stack_fffffffffffffd1e,
                                                   CONCAT15(in_stack_fffffffffffffd1d,
                                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                           );
            if ((bool)in_stack_fffffffffffffd1e) {
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                         &stack0xfffffffffffffe80,(size_type)local_2a0);
              Bipartition::addOne(this,CONCAT17(in_stack_fffffffffffffd1f,
                                                CONCAT16(in_stack_fffffffffffffd1e,
                                                         CONCAT15(in_stack_fffffffffffffd1d,
                                                                  CONCAT14(in_stack_fffffffffffffd1c
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                                 );
            }
          }
          for (local_2a8 = 0; local_2a8 < local_38; local_2a8 = local_2a8 + 1) {
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[](in_RSI,local_2a8)
            ;
            in_stack_fffffffffffffd1d =
                 Bipartition::properlyContains
                           (this,(Bipartition *)
                                 CONCAT17(in_stack_fffffffffffffd1f,
                                          CONCAT16(in_stack_fffffffffffffd1e,
                                                   CONCAT15(in_stack_fffffffffffffd1d,
                                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                           );
            if ((bool)in_stack_fffffffffffffd1d) {
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        (&local_198,local_2a8);
              Bipartition::addOne(this,CONCAT17(in_stack_fffffffffffffd1f,
                                                CONCAT16(in_stack_fffffffffffffd1e,
                                                         CONCAT15(in_stack_fffffffffffffd1d,
                                                                  CONCAT14(in_stack_fffffffffffffd1c
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                                 );
            }
          }
          local_270 = local_270 + 1;
          local_259 = 1;
        }
        for (in_stack_fffffffffffffd50 = (vector<PhyloTree,_std::allocator<PhyloTree>_> *)0x0;
            in_stack_fffffffffffffd50 < destination_b_00;
            in_stack_fffffffffffffd50 =
                 (vector<PhyloTree,_std::allocator<PhyloTree>_> *)
                 ((long)&(in_stack_fffffffffffffd50->
                         super__Vector_base<PhyloTree,_std::allocator<PhyloTree>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                    (in_RDI,(size_type)in_stack_fffffffffffffd50);
          in_stack_fffffffffffffd1c =
               Bipartition::properlyContains
                         (this,(Bipartition *)
                               CONCAT17(in_stack_fffffffffffffd1f,
                                        CONCAT16(in_stack_fffffffffffffd1e,
                                                 CONCAT15(in_stack_fffffffffffffd1d,
                                                          CONCAT14(in_stack_fffffffffffffd1c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                         );
          if ((bool)in_stack_fffffffffffffd1c) {
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                      (in_RDI,(size_type)in_stack_fffffffffffffd50);
            in_stack_fffffffffffffd1b =
                 Bipartition::contains
                           (this,CONCAT17(in_stack_fffffffffffffd1f,
                                          CONCAT16(in_stack_fffffffffffffd1e,
                                                   CONCAT15(in_stack_fffffffffffffd1d,
                                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                           );
            if ((bool)in_stack_fffffffffffffd1b) {
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                        (local_150,(size_type)in_stack_fffffffffffffd50);
              Bipartition::addOne(this,CONCAT17(in_stack_fffffffffffffd1f,
                                                CONCAT16(in_stack_fffffffffffffd1e,
                                                         CONCAT15(in_stack_fffffffffffffd1d,
                                                                  CONCAT14(in_stack_fffffffffffffd1c
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                                 );
            }
          }
        }
        for (__n = 0; __n < local_38; __n = __n + 1) {
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[](in_RSI,__n);
          in_stack_fffffffffffffd1a =
               Bipartition::properlyContains
                         (this,(Bipartition *)
                               CONCAT17(in_stack_fffffffffffffd1f,
                                        CONCAT16(in_stack_fffffffffffffd1e,
                                                 CONCAT15(in_stack_fffffffffffffd1d,
                                                          CONCAT14(in_stack_fffffffffffffd1c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                         );
          if ((bool)in_stack_fffffffffffffd1a) {
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[](in_RSI,__n);
            in_stack_fffffffffffffd19 =
                 Bipartition::contains
                           (this,CONCAT17(in_stack_fffffffffffffd1f,
                                          CONCAT16(in_stack_fffffffffffffd1e,
                                                   CONCAT15(in_stack_fffffffffffffd1d,
                                                            CONCAT14(in_stack_fffffffffffffd1c,
                                                                     CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                           );
            if ((bool)in_stack_fffffffffffffd19) {
              std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[](&local_168,__n)
              ;
              Bipartition::addOne(this,CONCAT17(in_stack_fffffffffffffd1f,
                                                CONCAT16(in_stack_fffffffffffffd1e,
                                                         CONCAT15(in_stack_fffffffffffffd1d,
                                                                  CONCAT14(in_stack_fffffffffffffd1c
                                                                           ,CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                                 );
            }
          }
        }
        local_268 = local_268 + 1;
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this,(value_type *)
                            CONCAT17(in_stack_fffffffffffffd1f,
                                     CONCAT16(in_stack_fffffffffffffd1e,
                                              CONCAT15(in_stack_fffffffffffffd1d,
                                                       CONCAT14(in_stack_fffffffffffffd1c,
                                                                CONCAT13(in_stack_fffffffffffffd1b,
                                                                         CONCAT12(
                                                  in_stack_fffffffffffffd1a,
                                                  CONCAT11(in_stack_fffffffffffffd19,
                                                           in_stack_fffffffffffffd18))))))));
        for (local_2bc = 0;
            (vector<PhyloTree,_std::allocator<PhyloTree>_> *)(long)local_2bc < destination_b_00;
            local_2bc = local_2bc + 1) {
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                    (in_RDI,(long)local_2bc);
          in_stack_fffffffffffffd18 =
               Bipartition::contains
                         (this,CONCAT17(in_stack_fffffffffffffd1f,
                                        CONCAT16(in_stack_fffffffffffffd1e,
                                                 CONCAT15(in_stack_fffffffffffffd1d,
                                                          CONCAT14(in_stack_fffffffffffffd1c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                         );
          if ((bool)in_stack_fffffffffffffd18) {
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                      ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                       &stack0xfffffffffffffe80,(long)local_2bc);
            Bipartition::addOne(this,CONCAT17(in_stack_fffffffffffffd1f,
                                              CONCAT16(in_stack_fffffffffffffd1e,
                                                       CONCAT15(in_stack_fffffffffffffd1d,
                                                                CONCAT14(in_stack_fffffffffffffd1c,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                               );
          }
        }
        for (local_2c0 = 0; (ulong)(long)local_2c0 < local_38; local_2c0 = local_2c0 + 1) {
          std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                    (in_RSI,(long)local_2c0);
          in_stack_fffffffffffffd17 =
               Bipartition::contains
                         (this,CONCAT17(in_stack_fffffffffffffd1f,
                                        CONCAT16(in_stack_fffffffffffffd1e,
                                                 CONCAT15(in_stack_fffffffffffffd1d,
                                                          CONCAT14(in_stack_fffffffffffffd1c,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                         );
          if ((bool)in_stack_fffffffffffffd17) {
            std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator[]
                      (&local_198,(long)local_2c0);
            Bipartition::addOne(this,CONCAT17(in_stack_fffffffffffffd1f,
                                              CONCAT16(in_stack_fffffffffffffd1e,
                                                       CONCAT15(in_stack_fffffffffffffd1d,
                                                                CONCAT14(in_stack_fffffffffffffd1c,
                                                                         CONCAT13(
                                                  in_stack_fffffffffffffd1b,
                                                  CONCAT12(in_stack_fffffffffffffd1a,
                                                           CONCAT11(in_stack_fffffffffffffd19,
                                                                    in_stack_fffffffffffffd18)))))))
                               );
          }
        }
        local_270 = local_270 + 1;
      }
      local_278 = (Bipartition *)((long)&local_278->_vptr_Bipartition + 1);
    }
    deleteEmptyEdges((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffd50);
    deleteEmptyEdges((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffd50);
    splitOnCommonEdge(in_RSI,in_RDX,in_RCX,in_R8,destination_b_00);
    deleteEmptyEdges((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffd50);
    deleteEmptyEdges((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)
                     in_stack_fffffffffffffd50);
    splitOnCommonEdge(in_RSI,in_RDX,in_RCX,in_R8,destination_b_00);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this);
    std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~vector
              ((vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this);
    local_104 = 0;
    PhyloTreeEdge::~PhyloTreeEdge
              ((PhyloTreeEdge *)CONCAT17(in_stack_fffffffffffffd17,in_stack_fffffffffffffd10));
    std::__cxx11::string::~string(local_58);
  }
  return;
}

Assistant:

void Geodesic::splitOnCommonEdge(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges,
        vector<string> &reference_leaf_num_map, vector<PhyloTree> &destination_a, vector<PhyloTree> &destination_b) {
    size_t numEdges1 = t1_edges.size(); // number of edges in tree 1
    size_t numEdges2 = t2_edges.size(); /// number of edges in tree 2
    if (numEdges1 == 0 || numEdges2 == 0) {
        return;
    }
    string leaf_label;
    // look for common edges
    PhyloTreeEdge commonEdge;
    try {
        commonEdge = PhyloTree::getFirstCommonEdge(t1_edges, t2_edges);
    }
    catch (edge_not_found_exception &err) {
        destination_a.reserve(destination_a.size() + numEdges1);
        destination_b.reserve(destination_b.size() + numEdges2);
        destination_a.emplace_back(t1_edges, reference_leaf_num_map);
        destination_b.emplace_back(t2_edges, reference_leaf_num_map);
        return;
    }

    // A will be the tree with leaves corresponding to 1's in commonEdge
    vector<string> leaf2NumMapA;
    vector<string> leaf2NumMapB;

    vector<PhyloTreeEdge> edgesA1;
    vector<PhyloTreeEdge> edgesA2;
    vector<PhyloTreeEdge> edgesB1;
    vector<PhyloTreeEdge> edgesB2;

    edgesA1.reserve(numEdges1);
    edgesA2.reserve(numEdges2);
    edgesB1.reserve(numEdges1);
    edgesB2.reserve(numEdges2);

    for (PhyloTreeEdge e : t1_edges) { // have to copy e <= DO NOT MAKE e A REFERENCE
        e.clear();
        edgesA1.push_back(e);
        edgesB1.push_back(e);
    }

    for (PhyloTreeEdge e : t2_edges) { // as above
        e.clear();
        edgesA2.push_back(e);
        edgesB2.push_back(e);
    }

    bool aLeavesAdded = false;  // if we have added a leaf in B representing the A tree
    size_t indexAleaves = 0;  // the index we are at in  the vectors holding the leaves in the A and B subtrees
    size_t indexBleaves = 0;

    // step through the leaves represented in commonEdge
    // (there should be two more leaves than edges)
    for (size_t i = 0; i < reference_leaf_num_map.size(); i++) {
        leaf_label = reference_leaf_num_map[i];
        if (commonEdge.contains(i)) {
            // commonEdge contains leaf i
            leaf2NumMapA.push_back(leaf_label);

            // these leaves must be added as a group to the B trees
            if (!aLeavesAdded) {
                leaf2NumMapB.push_back(leaf_label + "*");    // add a one of the leaves of the A tree to represent all the A trees leaves
                for (size_t j = 0; j < numEdges1; j++) {
                    if (t1_edges[j].properlyContains(commonEdge)) {
                        edgesB1[j].addOne(indexBleaves);
                    }
                }
                for (size_t j = 0; j < numEdges2; j++) {
                    if (t2_edges[j].properlyContains(commonEdge)) {
                        edgesB2[j].addOne(indexBleaves);
                    }
                }
                indexBleaves++;
                aLeavesAdded = true;
            }
            // add the column corresponding to this leaf to the A edges vector (for the corresponding trees)
            // XXX: problem: might be adding edges which contain leaves in A but also
            for (size_t j = 0; j < numEdges1; j++) {
                if (commonEdge.properlyContains(t1_edges[j]) && t1_edges[j].contains(i)) {
                    edgesA1[j].addOne(indexAleaves);
                }
            }
            for (size_t j = 0; j < numEdges2; j++) {
                if (commonEdge.properlyContains(t2_edges[j]) && t2_edges[j].contains(i)) {
                    edgesA2[j].addOne(indexAleaves);
                }
            }
            indexAleaves++;
        } else {
            // commonEdge does not contain leaf i
            leaf2NumMapB.push_back(leaf_label);
            for (int j = 0; j < numEdges1; j++) {
                if (t1_edges[j].contains(i)) {
                    edgesB1[j].addOne(indexBleaves);
                }
            }
            for (int j = 0; j < numEdges2; j++) {
                if (t2_edges[j].contains(i)) {
                    edgesB2[j].addOne(indexBleaves);
                }
            }
            indexBleaves++;
        }
    }

    deleteEmptyEdges(edgesA1);
    deleteEmptyEdges(edgesA2);
    splitOnCommonEdge(edgesA1, edgesA2, leaf2NumMapA, destination_a, destination_b);

    deleteEmptyEdges(edgesB1);
    deleteEmptyEdges(edgesB2);
    splitOnCommonEdge(edgesB1, edgesB2, leaf2NumMapB, destination_a, destination_b);
}